

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

bool __thiscall
ON_BinaryArchive::ArchiveContains3dmTable(ON_BinaryArchive *this,ON_3dmArchiveTableType table)

{
  bool bVar1;
  archive_mode aVar2;
  uint local_18;
  uint opennurbs_library_version;
  ON_3dmArchiveTableType table_local;
  ON_BinaryArchive *this_local;
  
  local_18 = 0;
  aVar2 = Mode(this);
  if (aVar2 == read3dm) {
    local_18 = this->m_3dm_opennurbs_version;
  }
  else {
    aVar2 = Mode(this);
    if (aVar2 == write3dm) {
      local_18 = ON::Version();
    }
  }
  if ((local_18 == 0) && (this->m_3dm_version < 4)) {
    local_18 = 0xbebf1b2;
  }
  bVar1 = ArchiveContains3dmTable(table,this->m_3dm_version,local_18);
  return bVar1;
}

Assistant:

bool ON_BinaryArchive::ArchiveContains3dmTable(
  ON_3dmArchiveTableType table
  ) const
{
  unsigned int opennurbs_library_version = 0;
  if (ON::archive_mode::read3dm == Mode())
    opennurbs_library_version = m_3dm_opennurbs_version;
  else if (ON::archive_mode::write3dm == Mode())
    opennurbs_library_version = ON::Version();

  if ( 0 == opennurbs_library_version && m_3dm_version <= 3)
    opennurbs_library_version = 200012210;
  
  return ON_BinaryArchive::ArchiveContains3dmTable(
    table,
    m_3dm_version,
    opennurbs_library_version
    );
}